

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int32_t icu_63::UnicodeSet::matchRest
                  (Replaceable *text,int32_t start,int32_t limit,UnicodeString *s)

{
  short sVar1;
  int iVar2;
  char16_t cVar3;
  int iVar4;
  int iVar5;
  int32_t iVar6;
  int iVar7;
  uint uVar8;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (start < limit) {
    iVar2 = limit - start;
    if (iVar6 <= limit - start) {
      iVar2 = iVar6;
    }
    iVar7 = 1;
    do {
      if (iVar2 <= iVar7) {
        return iVar2;
      }
      iVar4 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)(uint)(start + iVar7));
      cVar3 = UnicodeString::doCharAt(s,iVar7);
      iVar7 = iVar7 + 1;
    } while ((char16_t)iVar4 == cVar3);
  }
  else {
    iVar2 = start - limit;
    if (iVar6 <= start - limit) {
      iVar2 = iVar6;
    }
    iVar4 = iVar6 + -2;
    uVar8 = start - 1;
    iVar7 = 1;
    do {
      if (iVar2 <= iVar7) {
        return iVar2;
      }
      iVar5 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)uVar8);
      cVar3 = UnicodeString::doCharAt(s,iVar4);
      iVar7 = iVar7 + 1;
      iVar4 = iVar4 + -1;
      uVar8 = uVar8 - 1;
    } while ((char16_t)iVar5 == cVar3);
  }
  return 0;
}

Assistant:

int32_t UnicodeSet::matchRest(const Replaceable& text,
                              int32_t start, int32_t limit,
                              const UnicodeString& s) {
    int32_t i;
    int32_t maxLen;
    int32_t slen = s.length();
    if (start < limit) {
        maxLen = limit - start;
        if (maxLen > slen) maxLen = slen;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start + i) != s.charAt(i)) return 0;
        }
    } else {
        maxLen = start - limit;
        if (maxLen > slen) maxLen = slen;
        --slen; // <=> slen = s.length() - 1;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start - i) != s.charAt(slen - i)) return 0;
        }
    }
    return maxLen;
}